

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O2

bool __thiscall
BlockFilterIndex::CustomRewind(BlockFilterIndex *this,BlockRef *current_tip,BlockRef *new_tip)

{
  DataStream *this_00;
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  __uniq_ptr_data<CDBIterator,_std::default_delete<CDBIterator>,_true,_true> this_01;
  string *args_1;
  optional<uint256> *poVar7;
  int iVar8;
  long in_FS_OFFSET;
  Span<const_std::byte> key_00;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> db_it;
  CDBBatch batch;
  int local_d0;
  DBHeightKey key;
  DBHashKey local_c8;
  pair<uint256,_(anonymous_namespace)::DBVal> value;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  CDBBatch::CDBBatch(&batch,&((this->m_db)._M_t.
                              super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>
                              .super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->
                             super_CDBWrapper);
  this_01.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
  super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
  super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl =
       (__uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>)
       CDBWrapper::NewIterator
                 (&((this->m_db)._M_t.
                    super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>._M_t.
                    super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>.
                    super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->super_CDBWrapper);
  iVar8 = new_tip->height;
  iVar1 = current_tip->height;
  db_it._M_t.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
  super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
  super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl =
       (__uniq_ptr_data<CDBIterator,_std::default_delete<CDBIterator>,_true,_true>)
       (__uniq_ptr_data<CDBIterator,_std::default_delete<CDBIterator>,_true,_true>)
       this_01.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
       super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
       super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl;
  key.height = iVar8;
  CDBIterator::Seek<(anonymous_namespace)::DBHeightKey>
            ((CDBIterator *)
             this_01.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
             super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
             super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,&key);
  args_1 = &(this->super_BaseIndex).m_name;
  this_00 = &batch.ssValue;
  do {
    local_d0 = iVar8;
    if (iVar1 < iVar8) {
      CDBBatch::Write<unsigned_char,FlatFilePos>
                (&batch,"P16BlockFilterIndex",&this->m_next_filter_pos);
      bVar6 = CDBWrapper::WriteBatch
                        (&((this->m_db)._M_t.
                           super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>
                           .super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->
                          super_CDBWrapper,&batch,false);
      if (bVar6) {
        ReadFilterHeader((optional<uint256> *)&value,this,new_tip->height,&new_tip->hash);
        poVar7 = inline_assertion_check<true,std::optional<uint256>>
                           ((optional<uint256> *)&value,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/blockfilterindex.cpp"
                            ,0x152,"CustomRewind","ReadFilterHeader(new_tip.height, new_tip.hash)");
        uVar3 = *(undefined8 *)
                 &(poVar7->super__Optional_base<uint256,_true,_true>)._M_payload.
                  super__Optional_payload_base<uint256>._M_payload;
        uVar4 = *(undefined8 *)
                 ((long)&(poVar7->super__Optional_base<uint256,_true,_true>)._M_payload.
                         super__Optional_payload_base<uint256>._M_payload + 8);
        uVar5 = *(undefined8 *)
                 ((long)&(poVar7->super__Optional_base<uint256,_true,_true>)._M_payload.
                         super__Optional_payload_base<uint256>._M_payload + 0x18);
        *(undefined8 *)((this->m_last_header).super_base_blob<256U>.m_data._M_elems + 0x10) =
             *(undefined8 *)
              ((long)&(poVar7->super__Optional_base<uint256,_true,_true>)._M_payload.
                      super__Optional_payload_base<uint256>._M_payload + 0x10);
        *(undefined8 *)((this->m_last_header).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar5;
        *(undefined8 *)(this->m_last_header).super_base_blob<256U>.m_data._M_elems = uVar3;
        *(undefined8 *)((this->m_last_header).super_base_blob<256U>.m_data._M_elems + 8) = uVar4;
        bVar6 = true;
      }
      else {
LAB_006dd9da:
        bVar6 = false;
      }
      std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::~unique_ptr(&db_it);
      CDBBatch::~CDBBatch(&batch);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return bVar6;
      }
      __stack_chk_fail();
    }
    bVar6 = CDBIterator::GetKey<(anonymous_namespace)::DBHeightKey>
                      ((CDBIterator *)
                       this_01.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                       super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,&key);
    if ((!bVar6) || (key.height != local_d0)) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/blockfilterindex.cpp"
      ;
      source_file._M_len = 0x6a;
      logging_function._M_str = "CopyHeightIndexToHashIndex";
      logging_function._M_len = 0x1a;
      LogPrintFormatInternal<char[27],std::__cxx11::string,unsigned_char,int>
                (logging_function,source_file,0x12d,ALL,Error,(ConstevalFormatString<4U>)0xc8f817,
                 (char (*) [27])"CopyHeightIndexToHashIndex",args_1,"tscoinstats",&local_d0);
      goto LAB_006dd9da;
    }
    value.second.header.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    value.second.header.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    value.second.hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    value.first.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    value.second.pos.nFile = -1;
    value.second.pos.nPos = 0;
    bVar6 = CDBIterator::GetValue<std::pair<uint256,(anonymous_namespace)::DBVal>>
                      ((CDBIterator *)
                       this_01.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                       super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,&value);
    if (!bVar6) {
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/blockfilterindex.cpp"
      ;
      source_file_00._M_len = 0x6a;
      logging_function_00._M_str = "CopyHeightIndexToHashIndex";
      logging_function_00._M_len = 0x1a;
      LogPrintFormatInternal<char[27],std::__cxx11::string,unsigned_char,int>
                (logging_function_00,source_file_00,0x134,ALL,Error,
                 (ConstevalFormatString<4U>)0xc8f844,(char (*) [27])"CopyHeightIndexToHashIndex",
                 args_1,"tscoinstats",&local_d0);
      goto LAB_006dd9da;
    }
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x10] =
         value.first.super_base_blob<256U>.m_data._M_elems[0x10];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x11] =
         value.first.super_base_blob<256U>.m_data._M_elems[0x11];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x12] =
         value.first.super_base_blob<256U>.m_data._M_elems[0x12];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x13] =
         value.first.super_base_blob<256U>.m_data._M_elems[0x13];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x14] =
         value.first.super_base_blob<256U>.m_data._M_elems[0x14];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x15] =
         value.first.super_base_blob<256U>.m_data._M_elems[0x15];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x16] =
         value.first.super_base_blob<256U>.m_data._M_elems[0x16];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x17] =
         value.first.super_base_blob<256U>.m_data._M_elems[0x17];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x18] =
         value.first.super_base_blob<256U>.m_data._M_elems[0x18];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x19] =
         value.first.super_base_blob<256U>.m_data._M_elems[0x19];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
         value.first.super_base_blob<256U>.m_data._M_elems[0x1a];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
         value.first.super_base_blob<256U>.m_data._M_elems[0x1b];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
         value.first.super_base_blob<256U>.m_data._M_elems[0x1c];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
         value.first.super_base_blob<256U>.m_data._M_elems[0x1d];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
         value.first.super_base_blob<256U>.m_data._M_elems[0x1e];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
         value.first.super_base_blob<256U>.m_data._M_elems[0x1f];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[0] =
         value.first.super_base_blob<256U>.m_data._M_elems[0];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[1] =
         value.first.super_base_blob<256U>.m_data._M_elems[1];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[2] =
         value.first.super_base_blob<256U>.m_data._M_elems[2];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[3] =
         value.first.super_base_blob<256U>.m_data._M_elems[3];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[4] =
         value.first.super_base_blob<256U>.m_data._M_elems[4];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[5] =
         value.first.super_base_blob<256U>.m_data._M_elems[5];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[6] =
         value.first.super_base_blob<256U>.m_data._M_elems[6];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[7] =
         value.first.super_base_blob<256U>.m_data._M_elems[7];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[8] =
         value.first.super_base_blob<256U>.m_data._M_elems[8];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[9] =
         value.first.super_base_blob<256U>.m_data._M_elems[9];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[10] =
         value.first.super_base_blob<256U>.m_data._M_elems[10];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[0xb] =
         value.first.super_base_blob<256U>.m_data._M_elems[0xb];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[0xc] =
         value.first.super_base_blob<256U>.m_data._M_elems[0xc];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[0xd] =
         value.first.super_base_blob<256U>.m_data._M_elems[0xd];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[0xe] =
         value.first.super_base_blob<256U>.m_data._M_elems[0xe];
    local_c8.hash.super_base_blob<256U>.m_data._M_elems[0xf] =
         value.first.super_base_blob<256U>.m_data._M_elems[0xf];
    DataStream::reserve(&batch.ssKey,0x40);
    DataStream::reserve(this_00,0x400);
    DataStream::operator<<(&batch.ssKey,&local_c8);
    Serialize<DataStream,_(anonymous_namespace)::DBVal>(this_00,&value.second);
    key_00.m_data =
         batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
         _M_impl.super__Vector_impl_data._M_start + batch.ssKey.m_read_pos;
    key_00.m_size =
         (long)batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_finish - (long)key_00.m_data;
    CDBBatch::WriteImpl(&batch,key_00,this_00);
    if (batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
        .super__Vector_impl_data._M_finish !=
        batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
        .super__Vector_impl_data._M_start) {
      batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish =
           batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    batch.ssKey.m_read_pos = 0;
    if (batch.ssValue.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        batch.ssValue.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      batch.ssValue.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
      .super__Vector_impl_data._M_finish =
           batch.ssValue.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    batch.ssValue.m_read_pos = 0;
    CDBIterator::Next((CDBIterator *)
                      this_01.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>.
                      _M_t.super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                      super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
    iVar8 = local_d0 + 1;
  } while( true );
}

Assistant:

bool BlockFilterIndex::CustomRewind(const interfaces::BlockRef& current_tip, const interfaces::BlockRef& new_tip)
{
    CDBBatch batch(*m_db);
    std::unique_ptr<CDBIterator> db_it(m_db->NewIterator());

    // During a reorg, we need to copy all filters for blocks that are getting disconnected from the
    // height index to the hash index so we can still find them when the height index entries are
    // overwritten.
    if (!CopyHeightIndexToHashIndex(*db_it, batch, m_name, new_tip.height, current_tip.height)) {
        return false;
    }

    // The latest filter position gets written in Commit by the call to the BaseIndex::Rewind.
    // But since this creates new references to the filter, the position should get updated here
    // atomically as well in case Commit fails.
    batch.Write(DB_FILTER_POS, m_next_filter_pos);
    if (!m_db->WriteBatch(batch)) return false;

    // Update cached header
    m_last_header = *Assert(ReadFilterHeader(new_tip.height, new_tip.hash));
    return true;
}